

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectIndex
          (Interpreter *this,LocationRange *loc,HeapObject *obj,Identifier *f,uint offset)

{
  mapped_type pHVar1;
  HeapEntity *context;
  HeapEntity *context_00;
  GarbageCollectionMark *pGVar2;
  mapped_type *ppHVar3;
  RuntimeError *__return_storage_ptr__;
  GarbageCollectionMark *pGVar4;
  GarbageCollectionMark *pGVar5;
  undefined4 in_register_00000084;
  AST *pAVar6;
  HeapComprehensionObject *comp;
  uint found_at;
  BindingFrame binds;
  uint local_84;
  string local_80;
  undefined1 local_60 [48];
  
  local_84 = 0;
  context = (HeapEntity *)
            findObject((Interpreter *)f,(Identifier *)obj,(HeapObject *)(ulong)offset,
                       (uint)&local_84,(uint *)CONCAT44(in_register_00000084,offset));
  if (context == (HeapEntity *)0x0) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    encode_utf8(&local_80,(internal *)(f->name)._M_dataplus._M_p,
                (UString *)(f->name)._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "field does not exist: ",&local_80);
    Stack::makeError(__return_storage_ptr__,&this->stack,loc,(string *)local_60);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  context_00 = (HeapEntity *)
               __dynamic_cast(context,&(anonymous_namespace)::HeapLeafObject::typeinfo,
                              &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
  if (context_00 == (HeapEntity *)0x0) {
    pGVar5 = (GarbageCollectionMark *)context[6]._vptr_HeapEntity;
    pGVar2 = &context[5].mark;
    pGVar4 = pGVar2;
    if (pGVar5 != (GarbageCollectionMark *)0x0) {
      do {
        if (*(Identifier **)(pGVar5 + 0x20) >= f) {
          pGVar4 = pGVar5;
        }
        pGVar5 = *(GarbageCollectionMark **)
                  (pGVar5 + (ulong)(*(Identifier **)(pGVar5 + 0x20) < f) * 8 + 0x10);
      } while (pGVar5 != (GarbageCollectionMark *)0x0);
      if ((pGVar4 != pGVar2) && (*(Identifier **)(pGVar4 + 0x20) <= f)) {
        pGVar2 = pGVar4;
      }
    }
    pHVar1 = *(mapped_type *)(pGVar2 + 0x28);
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)local_60,
          (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)(context + 1));
    ppHVar3 = std::
              map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                            *)local_60,(key_type *)&context[4].mark);
    *ppHVar3 = pHVar1;
    Stack::newCall(&this->stack,loc,context,obj,local_84,(BindingFrame *)local_60);
    pAVar6 = (AST *)context[4]._vptr_HeapEntity;
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                *)local_60._16_8_,(_Link_type)loc);
  }
  else {
    pGVar5 = (GarbageCollectionMark *)context_00[5]._vptr_HeapEntity;
    pGVar2 = &context_00[4].mark;
    pGVar4 = pGVar2;
    if (pGVar5 != (GarbageCollectionMark *)0x0) {
      do {
        if (*(Identifier **)(pGVar5 + 0x20) >= f) {
          pGVar4 = pGVar5;
        }
        pGVar5 = *(GarbageCollectionMark **)
                  (pGVar5 + (ulong)(*(Identifier **)(pGVar5 + 0x20) < f) * 8 + 0x10);
      } while (pGVar5 != (GarbageCollectionMark *)0x0);
      if ((pGVar4 != pGVar2) && (*(Identifier **)(pGVar4 + 0x20) <= f)) {
        pGVar2 = pGVar4;
      }
    }
    pAVar6 = *(AST **)(pGVar2 + 0x30);
    Stack::newCall(&this->stack,loc,context_00,obj,local_84,(BindingFrame *)(context_00 + 1));
  }
  return pAVar6;
}

Assistant:

const AST *objectIndex(const LocationRange &loc, HeapObject *obj, const Identifier *f,
                           unsigned offset)
    {
        unsigned found_at = 0;
        HeapObject *self = obj;
        HeapLeafObject *found = findObject(f, obj, offset, found_at);
        if (found == nullptr) {
            throw makeError(loc, "field does not exist: " + encode_utf8(f->name));
        }
        if (auto *simp = dynamic_cast<HeapSimpleObject *>(found)) {
            auto it = simp->fields.find(f);
            const AST *body = it->second.body;

            stack.newCall(loc, simp, self, found_at, simp->upValues);
            return body;
        } else {
            // If a HeapLeafObject is not HeapSimpleObject, it must be HeapComprehensionObject.
            auto *comp = static_cast<HeapComprehensionObject *>(found);
            auto it = comp->compValues.find(f);
            auto *th = it->second;
            BindingFrame binds = comp->upValues;
            binds[comp->id] = th;
            stack.newCall(loc, comp, self, found_at, binds);
            return comp->value;
        }
    }